

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_jump
          (irGenerator *this,JumpInstructionKind kind,LabelId bbTrue,LabelId bbFalse,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *condRetName,JumpKind jumpKind)

{
  bool bVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  undefined8 uVar4;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_00;
  JumpKind local_d0;
  anon_class_1_0_00000001 local_c9;
  uint32_t local_c8;
  int local_c4;
  undefined1 local_c0 [16];
  byte local_b0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  byte local_88;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  byte local_60;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  byte local_38;
  
  bVar1 = (condRetName->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged;
  if (bVar1 == true) {
    local_58._0_8_ = (long)&local_58 + 0x10;
    _Var2._M_p = (condRetName->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    local_c4 = bbTrue;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,_Var2._M_p,
               _Var2._M_p +
               (condRetName->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
    local_38 = 1;
    local_c8 = LeftValueToLabelId(this,(LeftVal *)&local_58._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_38]._M_data)
              ((anon_class_1_0_00000001 *)local_c0,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_58._M_first);
    local_38 = 0xff;
    bbTrue = local_c4;
  }
  local_d0 = jumpKind;
  if (kind == Return) {
    bbTrue = this->_ReturnBlockLabelId;
    if (bVar1 == false) {
      local_d0 = Undefined;
      kind = Br;
      bbFalse = -1;
      goto LAB_00187c73;
    }
    local_a8._0_8_ = (long)&local_a8 + 0x10;
    pcVar3 = (this->_ReturnVarName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar3,pcVar3 + (this->_ReturnVarName)._M_string_length);
    local_88 = 1;
    if ((condRetName->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    local_80._0_8_ = (long)&local_80 + 0x10;
    _Var2._M_p = (condRetName->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,_Var2._M_p,
               _Var2._M_p +
               (condRetName->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
    local_60 = 2;
    ir_assign(this,(LeftVal *)&local_a8._M_first,(RightVal *)&local_80._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_60]._M_data)
              ((anon_class_1_0_00000001 *)local_c0,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_80._M_first);
    local_60 = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_88]._M_data)
              ((anon_class_1_0_00000001 *)local_c0,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8._M_first);
    local_88 = 0xff;
    local_c0._0_8_ = operator_new(0x38);
    bbFalse = -1;
    kind = Br;
    local_d0 = Undefined;
  }
  else {
LAB_00187c73:
    local_c0._0_8_ = operator_new(0x38);
    if (bVar1 != false) {
      (((JumpInstruction *)local_c0._0_8_)->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001ed408;
      ((JumpInstruction *)local_c0._0_8_)->kind = kind;
      (((JumpInstruction *)local_c0._0_8_)->cond_or_ret).
      super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
      _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      (((JumpInstruction *)local_c0._0_8_)->cond_or_ret).
      super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_c8;
      (((JumpInstruction *)local_c0._0_8_)->cond_or_ret).
      super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
      goto LAB_00187cca;
    }
  }
  (((JumpInstruction *)local_c0._0_8_)->super_Displayable)._vptr_Displayable =
       (_func_int **)&PTR_display_001ed408;
  ((JumpInstruction *)local_c0._0_8_)->kind = kind;
  (((JumpInstruction *)local_c0._0_8_)->cond_or_ret).
  super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
  super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
LAB_00187cca:
  ((JumpInstruction *)local_c0._0_8_)->bb_true = bbTrue;
  ((JumpInstruction *)local_c0._0_8_)->bb_false = bbFalse;
  ((JumpInstruction *)local_c0._0_8_)->jump_kind = local_d0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::JumpInstruction*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8),
             (JumpInstruction *)local_c0._0_8_);
  uVar4 = local_c0._0_8_;
  this_00 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
    }
  }
  local_b0 = 1;
  local_c0._0_8_ = uVar4;
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_00,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_c0);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
    ::_S_vtable._M_arr[local_b0]._M_data)
            (&local_c9,
             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)local_c0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  return;
}

Assistant:

void irGenerator::ir_jump(mir::inst::JumpInstructionKind kind, LabelId bbTrue,
                          LabelId bbFalse, std::optional<string> condRetName,
                          mir::inst::JumpKind jumpKind) {
  std::optional<VarId> crn;
  shared_ptr<mir::inst::JumpInstruction> jumpInst;

  if (condRetName.has_value()) {
    crn = VarId(LeftValueToLabelId(condRetName.value()));
  } else {
    crn = std::nullopt;
  }

  if (kind == mir::inst::JumpInstructionKind::Return) {
    kind = mir::inst::JumpInstructionKind::Br;
    bbTrue = _ReturnBlockLabelId;
    bbFalse = -1;
    if (crn.has_value()) {
      ir_assign(_ReturnVarName, condRetName.value());
      crn.reset();
    }
    jumpKind = mir::inst::JumpKind::Undefined;
  }

  jumpInst = shared_ptr<mir::inst::JumpInstruction>(
      new mir::inst::JumpInstruction(kind, bbTrue, bbFalse, crn, jumpKind));

  _funcNameToInstructions[_funcStack.back()].push_back(jumpInst);
}